

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Matcher::RunContStack
          (Matcher *this,Char *input,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack
          ,AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  CharCount CVar2;
  bool bVar3;
  ContTag CVar4;
  undefined4 *puVar5;
  RestoreLoopCont *this_00;
  GroupInfo *pGVar6;
  uint8 *puVar7;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00d45763:
  do {
    PopStats(this,contStack,input);
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Pop
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if (this_00 == (RestoreLoopCont *)0x0) goto LAB_00d45933;
    CVar4 = (this_00->super_Cont).tag;
    if (RewindLoopFixedGroupLastIteration < CVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13d3,"(cont->tag >= minContTag && cont->tag <= maxContTag)",
                         "cont->tag >= minContTag && cont->tag <= maxContTag");
      if (!bVar3) goto LAB_00d459a7;
      *puVar5 = 0;
      CVar4 = (this_00->super_Cont).tag;
    }
    switch(CVar4) {
    case Resume:
      *inputOffset = *(CharCount *)&(this_00->super_Cont).field_0xc;
      puVar7 = LabelToInstPointer(this,(this_00->origLoopInfo).number);
      *instPointer = puVar7;
      goto LAB_00d45933;
    case RestoreLoop:
      bVar3 = RestoreLoopCont::Exec
                        (this_00,this,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                        );
      break;
    case RestoreGroup:
      pGVar6 = GroupIdToGroupInfo(this,*(int *)&(this_00->super_Cont).field_0xc);
      CVar2 = (this_00->origLoopInfo).startInputOffset;
      pGVar6->offset = (this_00->origLoopInfo).number;
      pGVar6->length = CVar2;
      goto LAB_00d45763;
    case ResetGroup:
      ResetGroup(this,*(int *)&(this_00->super_Cont).field_0xc);
      goto LAB_00d45763;
    case ResetGroupRange:
      ResetInnerGroups(this,*(int *)&(this_00->super_Cont).field_0xc,(this_00->origLoopInfo).number)
      ;
      goto LAB_00d45763;
    case RepeatLoop:
      bVar3 = RepeatLoopCont::Exec
                        ((RepeatLoopCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      break;
    case PopAssertion:
      bVar3 = PopAssertionCont::Exec
                        ((PopAssertionCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      break;
    case RewindLoopFixed:
      bVar3 = RewindLoopFixedCont::Exec
                        ((RewindLoopFixedCont *)this_00,this,input,inputOffset,instPointer,contStack
                         ,assertionStack,qcTicks);
      break;
    case RewindLoopSet:
      bVar3 = RewindLoopSetCont::Exec
                        ((RewindLoopSetCont *)this_00,this,input,inputOffset,instPointer,contStack,
                         assertionStack,qcTicks);
      break;
    case RewindLoopSetWithFollowFirst:
      bVar3 = RewindLoopSetWithFollowFirstCont::Exec
                        ((RewindLoopSetWithFollowFirstCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      break;
    case RewindLoopFixedGroupLastIteration:
      bVar3 = RewindLoopFixedGroupLastIterationCont::Exec
                        ((RewindLoopFixedGroupLastIterationCont *)this_00,this,input,inputOffset,
                         instPointer,contStack,assertionStack,qcTicks);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x13dc,"(false)","false");
      if (!bVar3) {
LAB_00d459a7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      goto LAB_00d45933;
    }
    if (bVar3 != false) {
LAB_00d45933:
      return this_00 == (RestoreLoopCont *)0x0;
    }
  } while( true );
}

Assistant:

inline bool Matcher::RunContStack(const Char* const input, CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks)
    {
        while (true)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            PopStats(contStack, input);
#endif
            Cont* cont = contStack.Pop();
            if (cont == 0)
            {
                break;
            }

            Assert(cont->tag >= minContTag && cont->tag <= maxContTag);
            // All these cases RESUME EXECUTION if backtracking finds a stop point
            const Cont::ContTag tag = cont->tag;
            switch (tag)
            {
#define M(O) case Cont::ContTag::O: if (((O##Cont*)cont)->Exec(*this, input, inputOffset, instPointer, contStack, assertionStack, qcTicks)) return false; break;
#include "RegexContcodes.h"
#undef M
            default:
                Assert(false); // should never be reached
                return false;  // however, can't use complier optimization if we wnat to return false here
            }
        }
        return true;
    }